

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_SubDEdgePtr * __thiscall
ON_ClassArray<ON_SubDEdgePtr>::SetCapacity(ON_ClassArray<ON_SubDEdgePtr> *this,size_t new_capacity)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar4;
  ON_SubDEdgePtr *pOVar3;
  
  uVar1 = this->m_capacity;
  if (uVar1 == 0) {
    this->m_a = (ON_SubDEdgePtr *)0x0;
    this->m_count = 0;
  }
  uVar4 = (uint)new_capacity;
  if (0x7ffffffe < new_capacity - 1 >> 1) {
    uVar4 = 0;
  }
  if ((int)uVar4 < 1) {
    if (this->m_a != (ON_SubDEdgePtr *)0x0) {
      (*this->_vptr_ON_ClassArray[4])(this,this->m_a,0);
      this->m_a = (ON_SubDEdgePtr *)0x0;
    }
  }
  else if ((int)uVar1 < (int)uVar4) {
    iVar2 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)uVar4);
    pOVar3 = (ON_SubDEdgePtr *)CONCAT44(extraout_var,iVar2);
    this->m_a = pOVar3;
    if (pOVar3 != (ON_SubDEdgePtr *)0x0) {
      memset(pOVar3 + this->m_capacity,0,((long)(int)uVar4 - (long)this->m_capacity) * 8);
      this->m_capacity = uVar4;
      goto LAB_0061261d;
    }
  }
  else {
    if (uVar1 <= uVar4) goto LAB_0061261d;
    if ((int)uVar4 < this->m_count) {
      this->m_count = uVar4;
    }
    this->m_capacity = uVar4;
    iVar2 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)uVar4);
    this->m_a = (ON_SubDEdgePtr *)CONCAT44(extraout_var_00,iVar2);
    if ((ON_SubDEdgePtr *)CONCAT44(extraout_var_00,iVar2) != (ON_SubDEdgePtr *)0x0)
    goto LAB_0061261d;
  }
  this->m_count = 0;
  this->m_capacity = 0;
LAB_0061261d:
  return this->m_a;
}

Assistant:

T* ON_ClassArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }
  // uses "placement" for class construction/destruction
  int i;
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX)
               ? (int)new_capacity 
               : 0;

  if ( capacity <= 0 ) {
    if ( m_a ) {
      for ( i = m_capacity-1; i >= 0; i-- ) {
        DestroyElement(m_a[i]);
      }
      Realloc(m_a,0);
      m_a = 0;
    }
    m_count = 0;
    m_capacity = 0;
  }
  else if ( m_capacity < capacity ) {
    // growing
    m_a = Realloc( m_a, capacity );
    // initialize new elements with default constructor
    if ( 0 != m_a )
    {
      // even when m_a is an array of classes with vtable pointers,
      // this call to memset(..., 0, ...) is what I want to do
      // because in-place construction will be used when needed
      // on this memory.
      memset( (void*)(m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
      for ( i = m_capacity; i < capacity; i++ ) {
        ConstructDefaultElement(&m_a[i]);
      }
      m_capacity = capacity;
    }
    else
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  else if ( m_capacity > capacity ) {
    // shrinking
    for ( i = m_capacity-1; i >= capacity; i-- ) {
      DestroyElement(m_a[i]);
    }
    if ( m_count > capacity )
      m_count = capacity;
    m_capacity = capacity;
    m_a = Realloc( m_a, capacity );
    if ( 0 == m_a )
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  return m_a;
}